

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::AssertionExpr::visit<slang::ast::SampledValueExprVisitor>
          (AssertionExpr *this,SampledValueExprVisitor *visitor)

{
  logic_error *this_00;
  string local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SampledValueExprVisitor *local_18;
  SampledValueExprVisitor *visitor_local;
  AssertionExpr *this_local;
  
  local_18 = visitor;
  visitor_local = (SampledValueExprVisitor *)this;
  switch(this->kind) {
  case Invalid:
    SampledValueExprVisitor::visitInvalid(visitor,this);
    break;
  case Simple:
    SampledValueExprVisitor::visit<slang::ast::SimpleAssertionExpr>
              (visitor,(SimpleAssertionExpr *)this);
    break;
  case SequenceConcat:
    SampledValueExprVisitor::visit<slang::ast::SequenceConcatExpr>
              (visitor,(SequenceConcatExpr *)this);
    break;
  case SequenceWithMatch:
    SampledValueExprVisitor::visit<slang::ast::SequenceWithMatchExpr>
              (visitor,(SequenceWithMatchExpr *)this);
    break;
  case Unary:
    SampledValueExprVisitor::visit<slang::ast::UnaryAssertionExpr>
              (visitor,(UnaryAssertionExpr *)this);
    break;
  case Binary:
    SampledValueExprVisitor::visit<slang::ast::BinaryAssertionExpr>
              (visitor,(BinaryAssertionExpr *)this);
    break;
  case FirstMatch:
    SampledValueExprVisitor::visit<slang::ast::FirstMatchAssertionExpr>
              (visitor,(FirstMatchAssertionExpr *)this);
    break;
  case Clocking:
    SampledValueExprVisitor::visit<slang::ast::ClockingAssertionExpr>
              (visitor,(ClockingAssertionExpr *)this);
    break;
  case StrongWeak:
    SampledValueExprVisitor::visit<slang::ast::StrongWeakAssertionExpr>
              (visitor,(StrongWeakAssertionExpr *)this);
    break;
  case Abort:
    SampledValueExprVisitor::visit<slang::ast::AbortAssertionExpr>
              (visitor,(AbortAssertionExpr *)this);
    break;
  case Conditional:
    SampledValueExprVisitor::visit<slang::ast::ConditionalAssertionExpr>
              (visitor,(ConditionalAssertionExpr *)this);
    break;
  case Case:
    SampledValueExprVisitor::visit<slang::ast::CaseAssertionExpr>(visitor,(CaseAssertionExpr *)this)
    ;
    break;
  case DisableIff:
    SampledValueExprVisitor::visit<slang::ast::DisableIffAssertionExpr>
              (visitor,(DisableIffAssertionExpr *)this);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_b9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_f0,0x199);
    std::operator+(&local_78,&local_98,&local_f0);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

decltype(auto) AssertionExpr::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case AssertionExprKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case AssertionExprKind::Invalid: return visitor.visitInvalid(*this, std::forward<Args>(args)...);
        CASE(Simple, SimpleAssertionExpr);
        CASE(SequenceConcat, SequenceConcatExpr);
        CASE(SequenceWithMatch, SequenceWithMatchExpr);
        CASE(Unary, UnaryAssertionExpr);
        CASE(Binary, BinaryAssertionExpr);
        CASE(FirstMatch, FirstMatchAssertionExpr);
        CASE(Clocking, ClockingAssertionExpr);
        CASE(StrongWeak, StrongWeakAssertionExpr);
        CASE(Abort, AbortAssertionExpr);
        CASE(Conditional, ConditionalAssertionExpr);
        CASE(Case, CaseAssertionExpr);
        CASE(DisableIff, DisableIffAssertionExpr);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}